

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Vector.H
# Opt level: O3

Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> * __thiscall
amrex::GetVecOfPtrs<amrex::MultiFab,amrex::FabArray<amrex::FArrayBox>::FABType>
          (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *__return_storage_ptr__,
          amrex *this,Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *a)

{
  pointer *pppMVar1;
  MultiFab *pMVar2;
  iterator __position;
  MultiFab *x;
  MultiFab *pMVar3;
  MultiFab *local_28;
  
  (__return_storage_ptr__->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::reserve
            (&__return_storage_ptr__->
              super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>,
             (*(long *)(this + 8) - *(long *)this >> 7) * -0x5555555555555555);
  pMVar2 = *(MultiFab **)(this + 8);
  for (pMVar3 = *(MultiFab **)this; pMVar3 != pMVar2; pMVar3 = pMVar3 + 1) {
    __position._M_current =
         (__return_storage_ptr__->
         super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
         super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>
        ).super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_28 = pMVar3;
      std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::
      _M_realloc_insert<amrex::MultiFab*>
                ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)__return_storage_ptr__
                 ,__position,&local_28);
    }
    else {
      *__position._M_current = pMVar3;
      pppMVar1 = &(__return_storage_ptr__->
                  super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                  super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppMVar1 = *pppMVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Vector<T*> GetVecOfPtrs (Vector<T>& a)
    {
        Vector<T*> r;
        r.reserve(a.size());
        for (auto& x : a)  r.push_back(&x);
        return r;
    }